

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
OneWireSimulationDataGenerator::SimMatchRom
          (OneWireSimulationDataGenerator *this,U64 rom,bool overdrive)

{
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,overdrive) == 0) {
    SimWriteByte(this,0x55);
  }
  SimWriteByte(this,(U32)(rom & 0xff000000ff));
  SimWriteByte(this,(uint)(rom >> 8) & 0xff);
  SimWriteByte(this,(uint)(rom >> 0x10) & 0xff);
  SimWriteByte(this,(uint)(rom >> 0x18) & 0xff);
  SimWriteByte(this,(U32)((rom & 0xff000000ff) >> 0x20));
  SimWriteByte(this,(uint)(rom >> 0x28) & 0xff);
  SimWriteByte(this,(ushort)(rom >> 0x30) & 0xff);
  SimWriteByte(this,(uint)(byte)(rom >> 0x38));
  return;
}

Assistant:

void OneWireSimulationDataGenerator::SimMatchRom( U64 rom, bool overdrive )
{
    // Code: 0x55
    if( overdrive == false )
        SimWriteByte( 0x55 );
    SimWriteByte( U32( ( rom & 0x00000000000000FFull ) ) );       // family code
    SimWriteByte( U32( ( rom & 0x000000000000FF00ull ) >> 8 ) );  // Serial 1
    SimWriteByte( U32( ( rom & 0x0000000000FF0000ull ) >> 16 ) ); // Serial 2
    SimWriteByte( U32( ( rom & 0x00000000FF000000ull ) >> 24 ) ); // Serial 3
    SimWriteByte( U32( ( rom & 0x000000FF00000000ull ) >> 32 ) ); // Serial 4
    SimWriteByte( U32( ( rom & 0x0000FF0000000000ull ) >> 40 ) ); // Serial 5
    SimWriteByte( U32( ( rom & 0x00FF000000000000ull ) >> 48 ) ); // Serial 6
    SimWriteByte( U32( ( rom & 0xFF00000000000000ull ) >> 56 ) ); // CRC
}